

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O1

int to_private_key(char *bip38,uchar *bytes,size_t bytes_len,uchar *pass,size_t pass_len,
                  uint32_t flags,uchar *bytes_out,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined5 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char *bytes_00;
  int iVar11;
  uint32_t uVar12;
  size_t bytes_len_00;
  bool bVar13;
  int iVar14;
  bool bVar15;
  bip38_layout_t buf;
  char *addr58;
  derived_t derived;
  
  if ((flags & 0xffffe010) == 0) {
    if (((flags >> 10 & 1) != 0) || (len == 0x20 && bytes_out != (uchar *)0x0)) {
      if (bytes == (uchar *)0x0) {
        iVar11 = wally_base58_to_bytes(bip38,1,&buf.prefix,0x2b,(size_t *)&derived);
        bVar13 = CONCAT44(derived.half1_lo._4_4_,derived.half1_lo._0_4_) == 0x27;
        iVar14 = (bVar13 - 2) + (uint)bVar13;
        if (iVar11 != 0) {
          iVar14 = iVar11;
        }
        if (!bVar13 || iVar11 != 0) goto LAB_001650d6;
      }
      else {
        if (bytes_len != 0x27) goto LAB_001650d1;
        buf.u.swapped.hash = (uint32_t)((ulong)*(undefined8 *)(bytes + 0x1f) >> 0x20);
        uVar1 = *(undefined8 *)bytes;
        uVar2 = *(undefined8 *)(bytes + 8);
        uVar3 = *(undefined8 *)(bytes + 0x18);
        buf.u._13_3_ = (undefined3)*(undefined8 *)(bytes + 0x10);
        buf.u._16_5_ = (undefined5)((ulong)*(undefined8 *)(bytes + 0x10) >> 0x18);
        buf.u._21_3_ = (undefined3)uVar3;
        buf.u._24_4_ = (undefined4)((ulong)uVar3 >> 0x18);
        buf.u._29_3_ = (undefined3)((ulong)*(undefined8 *)(bytes + 0x1f) >> 8);
        buf.u.normal.half2[8] = (uchar)((ulong)uVar3 >> 0x38);
        buf.prefix = (uchar)uVar1;
        buf.ec_type = (uchar)((ulong)uVar1 >> 8);
        buf.flags = (uchar)((ulong)uVar1 >> 0x10);
        buf.u.normal.hash = (uint32_t)((ulong)uVar1 >> 0x18);
        buf.u.normal.half1[0] = (uchar)((ulong)uVar1 >> 0x38);
        buf.u._5_3_ = (undefined3)uVar2;
        buf.u._8_4_ = (undefined4)((ulong)uVar2 >> 0x18);
        buf.u.normal.half1[8] = (uchar)((ulong)uVar2 >> 0x38);
      }
      uVar10 = buf.u.swapped.hash;
      uVar9 = buf.u._24_4_;
      uVar8 = buf.u._16_5_;
      uVar7 = buf.u._12_4_;
      uVar6 = buf.u._8_4_;
      uVar5 = buf.u._4_4_;
      uVar4 = buf.u.normal.hash;
      if (0xfff < flags) {
        derived.half1_lo[0] = buf.u._32_1_;
        derived.half1_lo[1] = buf.u._33_1_;
        derived.half1_lo[2] = buf.u._34_1_;
        derived.half1_lo[3] = buf.u._35_1_;
        derived.half1_lo[4] = buf.u._0_1_;
        derived.half1_lo[5] = buf.u._1_1_;
        derived.half1_lo[6] = buf.u._2_1_;
        derived.half1_lo[7] = buf.u._3_1_;
        derived.half1_lo[8] = buf.u._4_1_;
        derived.half1_lo[9] = buf.u._5_1_;
        derived.half1_lo[10] = buf.u._6_1_;
        derived.half1_lo[0xb] = buf.u._7_1_;
        derived.half1_lo[0xc] = buf.u._8_1_;
        derived.half1_lo[0xd] = buf.u._9_1_;
        derived.half1_lo[0xe] = buf.u._10_1_;
        derived.half1_lo[0xf] = buf.u._11_1_;
        derived.half1_hi[0] = buf.u._12_1_;
        derived.half1_hi[1] = buf.u._13_1_;
        derived.half1_hi[2] = buf.u._14_1_;
        derived.half1_hi[3] = buf.u._15_1_;
        derived.half1_hi._4_4_ = SUB54(buf.u._16_5_,0);
        derived.half1_hi._8_4_ = SUB84(CONCAT35(buf.u._21_3_,buf.u._16_5_) >> 0x20,0);
        derived.half1_hi[0xc] = buf.u._24_1_;
        derived.half1_hi[0xd] = buf.u._25_1_;
        derived.half1_hi[0xe] = buf.u._26_1_;
        derived.half1_hi[0xf] = buf.u._27_1_;
        derived.half2[0] = buf.u._28_1_;
        derived.half2[1] = buf.u._29_1_;
        derived.half2[2] = buf.u._30_1_;
        derived.half2[3] = buf.u._31_1_;
        buf.u.swapped.hash = buf.u._28_4_;
        buf.u.normal.hash = uVar10;
        buf.u._4_4_ = uVar4;
        buf.u._8_4_ = uVar5;
        buf.u._12_4_ = uVar6;
        buf.u._16_5_ = (undefined5)CONCAT44(derived.half1_hi._4_4_,uVar7);
        buf.u._21_3_ = (undefined3)((uint5)uVar8 >> 8);
        buf.u._24_1_ = derived.half1_hi[8];
        buf.u._25_1_ = derived.half1_hi[9];
        buf.u._26_1_ = derived.half1_hi[10];
        buf.u._27_1_ = derived.half1_hi[0xb];
        buf.u._28_4_ = uVar9;
        wally_clear(&derived,0x24);
      }
      if (buf.prefix == '\x01') {
        iVar14 = -2;
        if ((buf.flags & 0x1b) == 0) {
          bVar15 = (buf.flags & 0xc4) == 0xc0;
          bVar13 = bVar15 && buf.ec_type == 'B';
          iVar14 = (bVar13 - 2) + (uint)bVar13;
          if (((flags >> 10 & 1) == 0) && (bVar15 && buf.ec_type == 'B')) {
            iVar14 = wally_scrypt(pass,pass_len,(uchar *)&buf.u,4,0x4000,8,8,derived.half1_lo,0x40);
            if (iVar14 == 0) {
              aes_dec_impl(buf.u.normal.half1,derived.half1_lo,derived.half2,bytes_out);
              aes_dec_impl(buf.u.normal.half2,derived.half1_hi,derived.half2,bytes_out + 0x10);
              uVar4 = buf.u.normal.hash;
              if ((flags >> 0xb & 1) == 0) {
                addr58 = (char *)0x0;
                iVar14 = address_from_private_key
                                   (bytes_out,len,(uchar)flags,(_Bool)((buf.flags & 0x20) >> 5),
                                    &addr58);
                bytes_00 = addr58;
                uVar4 = buf.u.normal.hash;
                if (iVar14 == 0) {
                  bytes_len_00 = strlen(addr58);
                  uVar12 = base58_get_checksum((uchar *)bytes_00,bytes_len_00);
                  iVar14 = (uint)(uVar4 == uVar12) * 2 + -2;
                }
                wally_free_string(addr58);
              }
              else {
                uVar12 = base58_get_checksum(bytes_out,len);
                iVar14 = (uint)(uVar4 == uVar12) * 2 + -2;
              }
            }
          }
        }
        goto LAB_001650d6;
      }
    }
  }
LAB_001650d1:
  iVar14 = -2;
LAB_001650d6:
  wally_clear_2(&derived,0x40,&buf,0x2c);
  return iVar14;
}

Assistant:

static int to_private_key(const char *bip38,
                          const unsigned char *bytes, size_t bytes_len,
                          const unsigned char *pass, size_t pass_len,
                          uint32_t flags,
                          unsigned char *bytes_out, size_t len)
{
    struct derived_t derived;
    struct bip38_layout_t buf;
    int ret = WALLY_EINVAL;

    if (flags & ~BIP38_ALL_DEFINED_FLAGS)
        goto finish;

    if (!(flags & BIP38_KEY_QUICK_CHECK) &&
        (!bytes_out || len != EC_PRIVATE_KEY_LEN))
        goto finish;

    if (bytes) {
        if (bytes_len != BIP38_SERIALIZED_LEN)
            goto finish;
        memcpy(&buf.prefix, bytes, BIP38_SERIALIZED_LEN);
    } else {
        size_t written;
        if ((ret = wally_base58_to_bytes(bip38, BASE58_FLAG_CHECKSUM, &buf.prefix,
                                         BIP38_SERIALIZED_LEN + BASE58_CHECKSUM_LEN,
                                         &written)))
            goto finish;

        if (written != BIP38_SERIALIZED_LEN) {
            ret = WALLY_EINVAL;
            goto finish;
        }
    }

    if (flags & BIP38_KEY_SWAP_ORDER) {
        /* Shuffle hash from the end to the beginning (swapped->normal) */
        struct bip38_sublayout_t normal;
        normal.hash = buf.u.swapped.hash;
        memcpy(normal.half1, buf.u.swapped.half1, sizeof(buf.u.swapped.half1));
        memcpy(normal.half2, buf.u.swapped.half2, sizeof(buf.u.swapped.half2));
        memcpy(&buf.u.normal, &normal, sizeof(normal));
        wally_clear(&normal, sizeof(normal));
    }

    if (buf.prefix != BIP38_PREFIX ||
        buf.flags & BIP38_FLAGS_RESERVED ||
        (buf.flags & BIP38_FLAG_DEFAULT) != BIP38_FLAG_DEFAULT ||
        buf.ec_type != BIP38_NO_ECMUL /* FIXME: EC Mul support */ ||
        buf.flags & BIP38_FLAG_HAVE_LOT) {
        ret = WALLY_EINVAL;
        goto finish;
    }

    if (flags & BIP38_KEY_QUICK_CHECK) {
        ret = WALLY_OK;
        goto finish;
    }

    if((ret = wally_scrypt(pass, pass_len,
                           (unsigned char *)&buf.u.normal.hash, sizeof(buf.u.normal.hash), 16384, 8, 8,
                           (unsigned char *)&derived, sizeof(derived))))
        goto finish;

    aes_dec_impl(buf.u.normal.half1, derived.half1_lo, derived.half2, bytes_out + 0);
    aes_dec_impl(buf.u.normal.half2, derived.half1_hi, derived.half2, bytes_out + 16);

    if (flags & BIP38_KEY_RAW_MODE) {
        if (buf.u.normal.hash != base58_get_checksum(bytes_out, len))
            ret = WALLY_EINVAL;
    } else {
        const unsigned char network = flags & 0xff;
        char *addr58 = NULL;
        ret = address_from_private_key(bytes_out, len, network,
                                       buf.flags & BIP38_FLAG_COMPRESSED, &addr58);
        if (!ret &&
            buf.u.normal.hash != base58_get_checksum((unsigned char *)addr58, strlen(addr58)))
            ret = WALLY_EINVAL;
        wally_free_string(addr58);
    }

finish:
    wally_clear_2(&derived, sizeof(derived), &buf, sizeof(buf));
    return ret;
}